

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpauseanimation.cpp
# Opt level: O1

void __thiscall QPauseAnimation::setDuration(QPauseAnimation *this,int msecs)

{
  QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
  *this_00;
  long lVar1;
  
  if (msecs < 0) {
    setDuration();
  }
  else {
    lVar1 = *(long *)(this + 8);
    this_00 = (QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
               *)(lVar1 + 0xa0);
    QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper(this_00);
    if (*(int *)(lVar1 + 0xa0) != msecs) {
      (this_00->super_QPropertyData<int>).val = msecs;
      QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>
      ::notify(this_00);
      return;
    }
  }
  return;
}

Assistant:

void QPauseAnimation::setDuration(int msecs)
{
    if (msecs < 0) {
        qWarning("QPauseAnimation::setDuration: cannot set a negative duration");
        return;
    }
    Q_D(QPauseAnimation);

    d->duration.removeBindingUnlessInWrapper();
    if (msecs != d->duration.valueBypassingBindings()) {
        d->duration.setValueBypassingBindings(msecs);
        d->duration.notify();
    }
}